

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_> *
wasm::WATParser::structtype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
           *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  bool bVar1;
  FieldsT *fields;
  string_view expected;
  undefined1 local_d8 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  namedFields;
  string local_80 [32];
  undefined1 local_60 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  _val;
  
  this = &ctx->in;
  expected._M_str = "struct";
  expected._M_len = 6;
  bVar1 = Lexer::takeSExprStart(this,expected);
  if (bVar1) {
    fields<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
                *)local_d8,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       *)local_60,
                      (_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       *)local_d8);
    if (_val.val.
        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
      std::__cxx11::string::string(local_80,(string *)local_60);
      std::__detail::__variant::
      _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,local_80);
      std::__cxx11::string::~string(local_80);
      std::__detail::__variant::
      _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           *)local_60);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           *)local_60);
      bVar1 = Lexer::takeRParen(this);
      if (bVar1) {
        fields = (FieldsT *)0x0;
        if (namedFields.val.
            super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
          fields = (FieldsT *)local_d8;
        }
        TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStruct
                  ((StructT *)local_60,&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                   fields);
        std::__detail::__variant::
        _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>,wasm::None,wasm::Err>
        ::
        _Variant_storage<0ul,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>>
                  ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,local_60);
        std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>::~pair
                  ((pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *)
                   local_60);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&namedFields.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   + 0x30),"expected end of struct definition",(allocator<char> *)local_80);
        Lexer::err((Err *)local_60,this,
                   (string *)
                   ((long)&namedFields.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   + 0x30));
        std::__detail::__variant::
        _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,local_60);
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&namedFields.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   + 0x30));
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         *)local_d8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 0x30) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::StructT> structtype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("struct"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of struct definition");
  }

  return ctx.makeStruct(*namedFields);
}